

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfuturewatcher.cpp
# Opt level: O2

void __thiscall
QFutureWatcherBasePrivate::sendCallOutEvent
          (QFutureWatcherBasePrivate *this,QFutureCallOutEvent *event)

{
  QAtomicInt *pQVar1;
  int _t2;
  QObject *this_00;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  int i;
  
  if (event->callOutType < (ResultsReady|Finished)) {
    this_00 = (this->super_QObjectPrivate).super_QObjectData.q_ptr;
    switch(event->callOutType) {
    case Started:
      QFutureWatcherBase::started((QFutureWatcherBase *)this_00);
      return;
    case Finished:
      QFutureWatcherBase::finished((QFutureWatcherBase *)this_00);
      return;
    case Canceled:
      (this->pendingResultsReady).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i = 0;
      QFutureWatcherBase::canceled((QFutureWatcherBase *)this_00);
      return;
    case Suspending:
      iVar3 = (*((QObject *)&this_00->_vptr_QObject)->_vptr_QObject[0xd])(this_00);
      bVar2 = QFutureInterfaceBase::isCanceled
                        ((QFutureInterfaceBase *)CONCAT44(extraout_var_00,iVar3));
      if (!bVar2) {
        QFutureWatcherBase::suspending((QFutureWatcherBase *)this_00);
        QFutureWatcherBase::paused((QFutureWatcherBase *)this_00);
        return;
      }
      break;
    case Suspended:
      iVar3 = (*((QObject *)&this_00->_vptr_QObject)->_vptr_QObject[0xd])(this_00);
      bVar2 = QFutureInterfaceBase::isCanceled((QFutureInterfaceBase *)CONCAT44(extraout_var,iVar3))
      ;
      if (!bVar2) {
        QFutureWatcherBase::suspended((QFutureWatcherBase *)this_00);
        return;
      }
      break;
    case Resumed:
      iVar3 = (*((QObject *)&this_00->_vptr_QObject)->_vptr_QObject[0xd])(this_00);
      bVar2 = QFutureInterfaceBase::isCanceled
                        ((QFutureInterfaceBase *)CONCAT44(extraout_var_01,iVar3));
      if (!bVar2) {
        QFutureWatcherBase::resumed((QFutureWatcherBase *)this_00);
        return;
      }
      break;
    case Progress:
      iVar3 = (*((QObject *)&this_00->_vptr_QObject)->_vptr_QObject[0xd])(this_00);
      bVar2 = QFutureInterfaceBase::isCanceled
                        ((QFutureInterfaceBase *)CONCAT44(extraout_var_02,iVar3));
      if (!bVar2) {
        QFutureWatcherBase::progressValueChanged((QFutureWatcherBase *)this_00,event->index1);
        if ((event->text).d.ptr != (char16_t *)0x0) {
          QFutureWatcherBase::progressTextChanged((QFutureWatcherBase *)this_00,&event->text);
          return;
        }
      }
      break;
    case ProgressRange:
      QFutureWatcherBase::progressRangeChanged
                ((QFutureWatcherBase *)this_00,event->index1,event->index2);
      return;
    case ResultsReady:
      iVar3 = (*((QObject *)&this_00->_vptr_QObject)->_vptr_QObject[0xd])(this_00);
      bVar2 = QFutureInterfaceBase::isCanceled
                        ((QFutureInterfaceBase *)CONCAT44(extraout_var_03,iVar3));
      if (!bVar2) {
        LOCK();
        pQVar1 = &this->pendingResultsReady;
        iVar3 = (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
                super___atomic_base<int>._M_i;
        (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (iVar3 <= this->maximumPendingResultsReady) {
          iVar3 = (*((QObject *)&this_00->_vptr_QObject)->_vptr_QObject[0xd])(this_00);
          QFutureInterfaceBase::setThrottled
                    ((QFutureInterfaceBase *)CONCAT44(extraout_var_04,iVar3),false);
        }
        iVar3 = event->index1;
        _t2 = event->index2;
        QFutureWatcherBase::resultsReadyAt((QFutureWatcherBase *)this_00,iVar3,_t2);
        if (0 < (this->resultAtConnected).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
                _q_value.super___atomic_base<int>._M_i) {
          for (; iVar3 < _t2; iVar3 = iVar3 + 1) {
            QFutureWatcherBase::resultReadyAt((QFutureWatcherBase *)this_00,iVar3);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void QFutureWatcherBasePrivate::sendCallOutEvent(QFutureCallOutEvent *event)
{
    Q_Q(QFutureWatcherBase);

    switch (event->callOutType) {
        case QFutureCallOutEvent::Started:
            emit q->started();
        break;
        case QFutureCallOutEvent::Finished:
            emit q->finished();
        break;
        case QFutureCallOutEvent::Canceled:
            pendingResultsReady.storeRelaxed(0);
            emit q->canceled();
        break;
        case QFutureCallOutEvent::Suspending:
            if (q->futureInterface().isCanceled())
                break;
            emit q->suspending();
#if QT_DEPRECATED_SINCE(6, 0)
QT_WARNING_PUSH
QT_WARNING_DISABLE_DEPRECATED
            emit q->paused();
QT_WARNING_POP
#endif
        break;
        case QFutureCallOutEvent::Suspended:
            if (q->futureInterface().isCanceled())
                break;
            emit q->suspended();
        break;
        case QFutureCallOutEvent::Resumed:
            if (q->futureInterface().isCanceled())
                break;
            emit q->resumed();
        break;
        case QFutureCallOutEvent::ResultsReady: {
            if (q->futureInterface().isCanceled())
                break;

            if (pendingResultsReady.fetchAndAddRelaxed(-1) <= maximumPendingResultsReady)
                q->futureInterface().setThrottled(false);

            const int beginIndex = event->index1;
            const int endIndex = event->index2;

            emit q->resultsReadyAt(beginIndex, endIndex);

            if (resultAtConnected.loadRelaxed() <= 0)
                break;

            for (int i = beginIndex; i < endIndex; ++i)
                emit q->resultReadyAt(i);

        } break;
        case QFutureCallOutEvent::Progress:
            if (q->futureInterface().isCanceled())
                break;

            emit q->progressValueChanged(event->index1);
            if (!event->text.isNull()) // ###
                emit q->progressTextChanged(event->text);
        break;
        case QFutureCallOutEvent::ProgressRange:
            emit q->progressRangeChanged(event->index1, event->index2);
        break;
        default: break;
    }
}